

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O1

int lj_cf_jit_opt_start(lua_State *L)

{
  GCstr *__s1;
  size_t *psVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  GCstr *pGVar6;
  uint32_t uVar7;
  int narg;
  uint uVar8;
  char *pcVar9;
  GCstr *__s1_00;
  ulong uVar10;
  char *pcVar11;
  global_State *g;
  long lVar12;
  char *pcVar13;
  bool bVar14;
  
  g = (global_State *)(ulong)(L->glref).ptr32;
  iVar4 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
  if (iVar4 == 0) {
    *(uint *)&g[1].gc.freed = (uint)g[1].gc.freed & 0xf000ffff | 0x3ff0000;
  }
  else if (0 < iVar4) {
    narg = 1;
    do {
      pGVar6 = lj_lib_checkstr(L,narg);
      bVar2 = (char)pGVar6[1].nextgc.gcptr32 - 0x30;
      if ((bVar2 < 10) && (*(char *)((long)&pGVar6[1].nextgc.gcptr32 + 1) == '\0')) {
        uVar8 = 0x3ff0000;
        if (bVar2 < 3) {
          uVar8 = *(uint *)(&DAT_0015fbbc + (ulong)bVar2 * 4);
        }
        *(uint *)&g[1].gc.freed = (uint)g[1].gc.freed & 0xf000ffff | uVar8;
      }
      else {
        __s1 = pGVar6 + 1;
        cVar3 = (char)(__s1->nextgc).gcptr32;
        if (cVar3 == 'n') {
          if (*(char *)((long)&pGVar6[1].nextgc.gcptr32 + 1) == 'o') {
            __s1_00 = (GCstr *)((long)&(__s1->nextgc).gcptr32 +
                               (ulong)(*(char *)((long)&pGVar6[1].nextgc.gcptr32 + 2) == '-') + 2);
            goto LAB_0011fcb1;
          }
LAB_0011fcb9:
          bVar14 = false;
          __s1_00 = __s1;
        }
        else if (cVar3 == '-') {
          __s1_00 = (GCstr *)((long)&pGVar6[1].nextgc.gcptr32 + 1);
LAB_0011fcb1:
          bVar14 = true;
        }
        else {
          if (cVar3 != '+') goto LAB_0011fcb9;
          bVar14 = false;
          __s1_00 = (GCstr *)((long)&pGVar6[1].nextgc.gcptr32 + 1);
        }
        uVar8 = 0x10000;
        pcVar13 = 
        "\x04fold\x03cse\x03dce\x03fwd\x03dse\x06narrow\x04loop\x03abc\x04sink\x04fuse\x03fma";
        while( true ) {
          uVar10 = (ulong)(byte)*pcVar13;
          if (uVar10 == 0) {
            iVar5 = 2;
          }
          else {
            iVar5 = strncmp((char *)__s1_00,(char *)((byte *)pcVar13 + 1),uVar10);
            if ((iVar5 == 0) && (*(char *)((long)&(__s1_00->nextgc).gcptr32 + uVar10) == '\0')) {
              if (bVar14) {
                psVar1 = &g[1].gc.freed;
                *(uint *)psVar1 = (uint)*psVar1 & ~uVar8;
              }
              else {
                psVar1 = &g[1].gc.freed;
                *(uint *)psVar1 = (uint)*psVar1 | uVar8;
              }
              iVar5 = 1;
            }
            else {
              pcVar13 = (char *)((byte *)pcVar13 + uVar10 + 1);
              iVar5 = 0;
            }
          }
          if (iVar5 != 0) break;
          uVar8 = uVar8 * 2;
        }
        if (iVar5 == 2) {
          lVar12 = 0;
          pcVar9 = 
          "\bmaxtrace\tmaxrecord\nmaxirconst\amaxside\amaxsnap\tminstitch\ahotloop\ahotexit\atryside\ninstunroll\nloopunroll\ncallunroll\trecunroll\tsizemcode\bmaxmcode"
          ;
          do {
            uVar10 = (ulong)(byte)*pcVar9;
            iVar5 = strncmp((char *)__s1,(char *)((byte *)pcVar9 + 1),uVar10);
            if ((iVar5 == 0) && (*(char *)((long)&(__s1->nextgc).gcptr32 + uVar10) == '=')) {
              cVar3 = *(char *)((long)&pGVar6[1].nextgc.gcptr32 + uVar10 + 1);
              pcVar13 = (char *)0x0;
              if ((byte)(cVar3 - 0x30U) < 10) {
                pcVar11 = (char *)((long)&pGVar6[1].nextgc.gcptr32 + uVar10 + 2);
                uVar7 = 0;
                do {
                  uVar7 = (uint)(byte)(cVar3 - 0x30) + uVar7 * 10;
                  cVar3 = *pcVar11;
                  pcVar11 = pcVar11 + 1;
                } while ((byte)(cVar3 - 0x30U) < 10);
              }
              else {
                uVar7 = 0;
              }
              if (cVar3 == '\0') {
                g[3].gcroot[lVar12 + 7].gcptr32 = uVar7;
                pcVar13 = (char *)0x1;
                if (lVar12 == 6) {
                  lj_dispatch_init_hotcount(g);
                }
              }
              bVar14 = false;
            }
            else {
              pcVar9 = (char *)((byte *)pcVar9 + uVar10 + 1);
              bVar14 = true;
            }
            iVar5 = (int)pcVar13;
            if (!bVar14) goto LAB_0011fde0;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0xf);
          iVar5 = 0;
LAB_0011fde0:
          if (iVar5 == 0) {
            lj_err_callerv(L,LJ_ERR_JITOPT,__s1);
          }
        }
      }
      bVar14 = narg != iVar4;
      narg = narg + 1;
    } while (bVar14);
  }
  return 0;
}

Assistant:

LJLIB_CF(jit_opt_start)
{
  jit_State *J = L2J(L);
  int nargs = (int)(L->top - L->base);
  if (nargs == 0) {
    J->flags = (J->flags & ~JIT_F_OPT_MASK) | JIT_F_OPT_DEFAULT;
  } else {
    int i;
    for (i = 1; i <= nargs; i++) {
      const char *str = strdata(lj_lib_checkstr(L, i));
      if (!jitopt_level(J, str) &&
	  !jitopt_flag(J, str) &&
	  !jitopt_param(J, str))
	lj_err_callerv(L, LJ_ERR_JITOPT, str);
    }
  }
  return 0;
}